

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O3

void __thiscall IntVar::specialiseToLL(IntVar *this)

{
  Tint *pTVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint *in_RSI;
  IntVarEL *this_00;
  ulong uVar10;
  uint uVar11;
  vec<int> vStack_58;
  TrailElem TStack_48;
  IntVar *pIStack_38;
  
  this_00 = (IntVarEL *)this;
  iVar5 = (*(this->super_Var).super_Branching._vptr_Branching[3])();
  if ((iVar5 == 4) || (iVar5 == 2)) {
    return;
  }
  if (iVar5 == 1) {
    IntVarLL::IntVarLL((IntVarLL *)this,this);
    return;
  }
  specialiseToLL();
  pIStack_38 = this;
  iVar5 = (*(this_00->super_IntVar).super_Var.super_Branching._vptr_Branching[3])();
  if (iVar5 == 2) {
    return;
  }
  iVar5 = (*(this_00->super_IntVar).super_Var.super_Branching._vptr_Branching[3])(this_00);
  if (iVar5 == 4) {
    return;
  }
  uVar11 = *in_RSI;
  uVar10 = (ulong)uVar11;
  vStack_58.sz = uVar11;
  vStack_58.cap = uVar11;
  piVar6 = (int *)malloc(uVar10 * 4);
  vStack_58.data = piVar6;
  if (uVar10 != 0) {
    lVar2 = *(long *)(in_RSI + 2);
    uVar8 = 0;
    do {
      piVar6[uVar8] = *(int *)(lVar2 + uVar8 * 4);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
    if (uVar10 != 0) {
      lVar2 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar6,piVar6 + uVar10,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar6,piVar6 + uVar10);
      uVar7 = 0;
      uVar8 = 0;
      do {
        if (uVar7 == 0) {
          iVar5 = *piVar6;
LAB_00136b8f:
          piVar6[uVar8] = iVar5;
          uVar8 = (ulong)((int)uVar8 + 1);
        }
        else {
          iVar5 = piVar6[uVar7];
          if (iVar5 != piVar6[uVar7 - 1]) goto LAB_00136b8f;
        }
        uVar11 = (uint)uVar8;
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar10);
      goto LAB_00136ba6;
    }
  }
  uVar11 = 0;
LAB_00136ba6:
  iVar5 = (this_00->super_IntVar).min.v;
  iVar9 = *piVar6;
  vStack_58.sz = uVar11;
  if (iVar5 < iVar9) {
    pTVar1 = &(this_00->super_IntVar).min;
    TStack_48.sz = 4;
    TStack_48.pt = &pTVar1->v;
    TStack_48.x = iVar5;
    vec<TrailElem>::push(&engine.trail,&TStack_48);
    pTVar1->v = iVar9;
  }
  iVar5 = (this_00->super_IntVar).max.v;
  iVar9 = piVar6[uVar11 - 1];
  if (iVar9 < iVar5) {
    pTVar1 = &(this_00->super_IntVar).max;
    TStack_48.sz = 4;
    TStack_48.pt = &pTVar1->v;
    TStack_48.x = iVar5;
    vec<TrailElem>::push(&engine.trail,&TStack_48);
    pTVar1->v = iVar9;
    iVar9 = piVar6[uVar11 - 1];
  }
  iVar5 = -1;
  uVar4 = uVar11;
  if (uVar11 != 0) {
    do {
      iVar5 = iVar5 + 1;
      bVar3 = 1 < uVar4;
      uVar4 = (int)uVar4 >> 1;
    } while (bVar3);
  }
  if (iVar9 - *piVar6 < (int)(iVar5 * uVar11)) {
    IntVarEL::IntVarEL(this_00,&this_00->super_IntVar);
    iVar5 = (*(this_00->super_IntVar).super_Var.super_Branching._vptr_Branching[0x12])
                      (this_00,&vStack_58,0,1);
    if ((char)iVar5 == '\0') {
      puts("=====UNSATISFIABLE=====");
      printf("%% Top level failure!\n");
      exit(0);
    }
  }
  else {
    IntVarSL::IntVarSL((IntVarSL *)this_00,&this_00->super_IntVar,&vStack_58);
  }
  if (vStack_58.data != (int *)0x0) {
    free(vStack_58.data);
  }
  return;
}

Assistant:

void IntVar::specialiseToLL() {
	switch (getType()) {
		case INT_VAR_EL:
		case INT_VAR_SL:
			return;
		case INT_VAR:
			new (this) IntVarLL(*((IntVar*)this));
			break;
		default:
			NEVER;
	}
}